

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fy-emit.c
# Opt level: O0

void fy_emit_mapping_key_epilog(fy_emitter *emit,fy_emit_save_ctx *sc,fy_token *fyt_key)

{
  _Bool _Var1;
  int local_24;
  int tmp_indent;
  fy_token *fyt_key_local;
  fy_emit_save_ctx *sc_local;
  fy_emitter *emit_local;
  
  if ((fyt_key != (fy_token *)0x0) && (fyt_key->type == FYTT_ALIAS)) {
    fy_emit_write_ws(emit);
  }
  sc->flags = sc->flags & 0xfffffffb;
  fy_emit_write_indicator(emit,di_colon,sc->flags,sc->indent,fyewt_indicator);
  local_24 = sc->indent;
  _Var1 = fy_emit_token_has_comment(emit,fyt_key,fycp_right);
  if (_Var1) {
    if (((*(byte *)sc >> 1 & 1) == 0) && (_Var1 = fy_emit_is_json_mode(emit), !_Var1)) {
      local_24 = fy_emit_increase_indent(emit,sc->flags,sc->indent);
    }
    fy_emit_token_comment(emit,fyt_key,sc->flags,local_24,fycp_right);
    fy_emit_write_indent(emit,local_24);
  }
  sc->flags = sc->flags & 0x10U | 4;
  return;
}

Assistant:

static void fy_emit_mapping_key_epilog(struct fy_emitter *emit, struct fy_emit_save_ctx *sc,
                                       struct fy_token *fyt_key) {
    int tmp_indent;

    /* if the key is an alias, always output an extra whitespace */
    if (fyt_key && fyt_key->type == FYTT_ALIAS)
        fy_emit_write_ws(emit);

    sc->flags &= ~DDNF_MAP;

    fy_emit_write_indicator(emit, di_colon, sc->flags, sc->indent, fyewt_indicator);

    tmp_indent = sc->indent;
    if (fy_emit_token_has_comment(emit, fyt_key, fycp_right)) {

        if (!sc->flow && !fy_emit_is_json_mode(emit))
            tmp_indent = fy_emit_increase_indent(emit, sc->flags, sc->indent);

        fy_emit_token_comment(emit, fyt_key, sc->flags, tmp_indent, fycp_right);
        fy_emit_write_indent(emit, tmp_indent);
    }

    sc->flags = DDNF_MAP | (sc->flags & DDNF_FLOW);
}